

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

_Bool al_init_ttf_addon(void)

{
  ulong uVar1;
  
  if (ttf_inited) {
    uVar1 = _al_trace_prefix(__al_debug_channel,2,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                             ,0x453,"al_init_ttf_addon");
    if ((uVar1 & 1) != 0) {
      _al_trace_suffix("TTF addon already initialised.\n");
    }
  }
  else {
    FT_Init_FreeType(&ft);
    vt.font_height = ttf_font_height;
    vt.font_ascent = ttf_font_ascent;
    vt.font_descent = ttf_font_descent;
    vt.char_length = ttf_char_length;
    vt.text_length = ttf_text_length;
    vt.render_char = ttf_render_char;
    vt.render = ttf_render;
    vt.destroy = ttf_destroy;
    vt.get_text_dimensions = ttf_get_text_dimensions;
    vt.get_font_ranges = ttf_get_font_ranges;
    vt.get_glyph_dimensions = ttf_get_glyph_dimensions;
    vt.get_glyph_advance = ttf_get_glyph_advance;
    vt.get_glyph = ttf_get_glyph;
    al_register_font_loader(".ttf",al_load_ttf_font);
    ttf_inited = true;
  }
  return true;
}

Assistant:

bool al_init_ttf_addon(void)
{
   if (ttf_inited) {
      ALLEGRO_WARN("TTF addon already initialised.\n");
      return true;
   }

   FT_Init_FreeType(&ft);
   vt.font_height = ttf_font_height;
   vt.font_ascent = ttf_font_ascent;
   vt.font_descent = ttf_font_descent;
   vt.char_length = ttf_char_length;
   vt.text_length = ttf_text_length;
   vt.render_char = ttf_render_char;
   vt.render = ttf_render;
   vt.destroy = ttf_destroy;
   vt.get_text_dimensions = ttf_get_text_dimensions;
   vt.get_font_ranges = ttf_get_font_ranges;
   vt.get_glyph_dimensions = ttf_get_glyph_dimensions;
   vt.get_glyph_advance = ttf_get_glyph_advance;
   vt.get_glyph = ttf_get_glyph;

   al_register_font_loader(".ttf", al_load_ttf_font);

   /* Can't fail right now - in the future we might dynamically load
    * the FreeType DLL here and/or initialize FreeType (which both
    * could fail and would cause a false return).
    */
   ttf_inited = true;
   return ttf_inited;
}